

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamEuler::ComputeKRMmatricesGlobal
          (ChElementBeamEuler *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  SrcEvaluatorType *pSVar15;
  assign_op<double,_double> *paVar16;
  double *pdVar17;
  element_type *peVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  Index dstCols;
  ulong uVar22;
  ChMatrixConstRef pRVar23;
  pointer psVar24;
  undefined8 *puVar25;
  Index dstRows;
  double *pdVar26;
  char *pcVar27;
  Index index;
  long lVar28;
  long lVar29;
  ChMatrixConstRef pRVar30;
  ChMatrixConstRef pRVar31;
  ChMatrixConstRef pRVar32;
  undefined1 *puVar33;
  ChMatrixConstRef pRVar34;
  long lVar35;
  int i;
  long lVar36;
  int i_3;
  ulong uVar37;
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  double dVar43;
  double dVar44;
  undefined8 in_XMM0_Qb;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  DstEvaluatorType *pDVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  scalar_constant_op<double> *psVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  ChVectorDynamic<> FiD;
  ChVectorDynamic<> Fi0;
  ChVector<double> vb0;
  ActualDstType actualDst;
  ChVector<double> wb0;
  ChVector<double> va0;
  ChMatrixDynamic<> H_num;
  ChVector<double> wa0;
  ChVector<double> paD;
  ChQuaternion<double> qa0;
  DstEvaluatorType dstEvaluator_1;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  ChQuaternion<double> qb0;
  undefined1 local_661;
  undefined1 local_660 [16];
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> local_650;
  ChMatrixConstRef local_638;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  DenseStorage<double,__1,__1,__1,_1> local_610;
  ChMatrixConstRef local_5f8;
  DenseStorage<double,__1,__1,__1,_1> local_5f0;
  ChMatrixConstRef local_5d0;
  ChMatrixConstRef pRStack_5c8;
  ChElementBeamEuler *local_5b8;
  undefined1 local_5b0 [32];
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_590;
  ChMatrixConstRef local_540;
  undefined8 uStack_538;
  DenseStorage<double,__1,__1,__1,_1> local_530;
  double local_510;
  ChMatrixConstRef local_508;
  undefined1 local_500 [16];
  scalar_constant_op<double> sStack_4f0;
  scalar_constant_op<double> sStack_4e8;
  ChMatrixDynamic<> *local_4e0;
  variable_if_dynamic<long,__1> vStack_4d8;
  variable_if_dynamic<long,__1> vStack_4d0;
  ChMatrixConstRef pRStack_4c8;
  double local_4c0;
  RhsNested pMStack_4b8;
  double dStack_4b0;
  double dStack_4a8;
  double local_4a0;
  double dStack_498;
  double dStack_490;
  double dStack_488;
  double local_480;
  double dStack_478;
  double dStack_470;
  double dStack_468;
  double local_460;
  double dStack_458;
  double dStack_450;
  double dStack_448;
  double local_440;
  double dStack_438;
  double dStack_430;
  double dStack_428;
  double local_420;
  double dStack_418;
  double dStack_410;
  double dStack_408;
  double local_400;
  double dStack_3f8;
  double dStack_3f0;
  double dStack_3e8;
  undefined1 local_3d0 [40];
  double *local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  ChMatrixConstRef local_380;
  ChMatrixConstRef pRStack_378;
  ChMatrixConstRef pRStack_370;
  ChMatrixConstRef pRStack_368;
  ChMatrix33<double> local_350;
  double adStack_308 [2];
  undefined1 local_2f8 [16];
  variable_if_dynamic<long,__1> local_2e8;
  variable_if_dynamic<long,__1> local_2e0;
  double local_2d8;
  double *local_2d0;
  double local_2c8;
  ChMatrixConstRef local_2c0;
  undefined1 *local_2b8;
  undefined8 local_2a8;
  ChMatrixConstRef local_2a0;
  ChMatrixConstRef pRStack_298;
  ChMatrixConstRef apRStack_290 [2];
  undefined1 local_280 [32];
  variable_if_dynamic<long,__1> vStack_260;
  plainobjectbase_evaluator_data<double,_0> pStack_258;
  double dStack_250;
  double dStack_248;
  ChMatrixConstRef local_240;
  double dStack_238;
  double dStack_230;
  double dStack_228;
  double dStack_220;
  double dStack_218;
  double dStack_210;
  double dStack_208;
  double local_200;
  double dStack_1f8;
  double dStack_1f0;
  double dStack_1e8;
  double dStack_1e0;
  double dStack_1d8;
  double dStack_1d0;
  double dStack_1c8;
  double local_1c0;
  double dStack_1b8;
  double dStack_1b0;
  double dStack_1a8;
  double dStack_1a0;
  double dStack_198;
  double dStack_190;
  double dStack_188;
  double dStack_180;
  double dStack_178;
  double dStack_170;
  double dStack_168;
  double local_130;
  ChMatrix33<double> local_128;
  ChMatrixRef local_e0;
  ChMatrixRef local_a0 [2];
  
  local_638 = (ChMatrixConstRef)Rfactor;
  adStack_308[1] = Mfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value != 0xc) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 0xc)) {
    __assert_fail("(H.rows() == 12) && (H.cols() == 12)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x1d2,
                  "virtual void chrono::fea::ChElementBeamEuler::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  local_540 = (ChMatrixConstRef)Kfactor;
  if ((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x1d3,
                  "virtual void chrono::fea::ChElementBeamEuler::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  local_5f8 = (ChMatrixConstRef)H;
  local_5b8 = this;
  if ((((Kfactor == 0.0) && (!NAN(Kfactor))) && (Rfactor == 0.0)) && (!NAN(Rfactor))) {
    local_500._8_8_ = local_2f8;
    local_2f8._0_8_ = (ChMatrixConstRef)0x0;
    local_280._0_8_ =
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    local_500._0_8_ = local_280;
    local_280._16_8_ =
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).m_stride.m_outer.m_value;
    sStack_4f0.m_other = (double)local_3d0;
    sStack_4e8.m_other = (double)H;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_500);
LAB_006746f9:
    if (((adStack_308[1] != 0.0) || (NAN(adStack_308[1]))) ||
       ((((double)local_638 != 0.0 || (NAN((double)local_638))) &&
        ((dVar43 = ((this->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->rdamping_alpha, dVar43 != 0.0 || (NAN(dVar43))))))) {
      local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
      local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
      local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                ((DenseStorage<double,__1,__1,__1,_1> *)&local_350,0x90,0xc,0xc);
      local_500._0_8_ =
           local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_500._8_8_ =
           local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      sStack_4f0.m_other = 0.0;
      if ((long)((ulong)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] |
                (ulong)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1]) < 0) {
        pcVar27 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
        ;
        goto LAB_00674cca;
      }
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Matrix<double,__1,__1,_1,__1,__1> *)&local_350,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                  *)local_500,(assign_op<double,_double> *)local_280);
      peVar18 = (this->section).
                super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      (*(peVar18->super_ChBeamSection)._vptr_ChBeamSection[0xd])(peVar18,local_500);
      if ((this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        auVar59._8_8_ = 0;
        auVar59._0_8_ = adStack_308[1];
        auVar70._8_8_ = 0;
        auVar70._0_8_ = local_638;
        auVar12._8_8_ = 0;
        auVar12._0_8_ =
             ((this->section).
              super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->rdamping_alpha;
        auVar81 = vfmadd231sd_fma(auVar59,auVar70,auVar12);
        local_5d0 = (ChMatrixConstRef)((this->super_ChElementBeam).length * 0.5 * auVar81._0_8_);
        pRVar31 = (ChMatrixConstRef)0x18;
        lVar35 = 0;
        uVar37 = 0;
        local_2a0 = local_5d0;
        pRStack_298 = (ChMatrixConstRef)0x0;
        pRStack_5c8 = local_5d0;
        do {
          lVar29 = uVar37 * 6;
          lVar36 = uVar37 * 6 + 3;
          if (((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1] < lVar36) ||
             ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2] < lVar36)) {
LAB_00674d0a:
            pcVar27 = 
            "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
            ;
            goto LAB_00674d1f;
          }
          pdVar26 = (double *)
                    ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                            local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[0])->
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                           m_data.array +
                    (long)((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array[2] + 1) * lVar35 + 0x10);
          lVar28 = 0x10;
          do {
            dVar43 = *(double *)(local_500 + lVar28 + -8);
            pdVar26[-2] = (double)local_5d0 * *(double *)((long)&local_510 + lVar28) + pdVar26[-2];
            pdVar26[-1] = (double)pRStack_5c8 * dVar43 + pdVar26[-1];
            *pdVar26 = (double)local_2a0 * *(double *)(local_500 + lVar28) + *pdVar26;
            lVar28 = lVar28 + 0x30;
            pdVar26 = pdVar26 + (long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data.array[2];
          } while (lVar28 != 0xa0);
          lVar28 = lVar29 + 6;
          if (((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1] < lVar28) ||
             ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2] < lVar28)) goto LAB_00674d0a;
          local_630._0_8_ = lVar29;
          local_620._0_8_ = lVar29 + 3;
          local_380 = pRVar31;
          pdVar26 = (double *)
                    ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                            local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[0])->
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                           m_data.array +
                    (long)((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array[2] + 1) * (long)pRVar31 + 0x10);
          lVar29 = 0xb8;
          do {
            dVar43 = *(double *)(local_500 + lVar29 + -8);
            pdVar26[-2] = (double)local_5d0 * *(double *)((long)&local_510 + lVar29) + pdVar26[-2];
            pdVar26[-1] = (double)pRStack_5c8 * dVar43 + pdVar26[-1];
            *pdVar26 = (double)local_2a0 * *(double *)(local_500 + lVar29) + *pdVar26;
            lVar29 = lVar29 + 0x30;
            pdVar26 = pdVar26 + (long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data.array[2];
          } while (lVar29 != 0x148);
          local_280._0_8_ =
               &((local_5b8->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar37].
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->field_0x58;
          local_280._8_8_ = &sStack_4e8;
          local_280._24_8_ = local_500;
          vStack_260.m_value = 0;
          pStack_258.data = (double *)0x3;
          dStack_250 = 2.96439387504748e-323;
          local_240 = local_2a0;
          ChMatrix33<double>::operator=
                    ((ChMatrix33<double> *)local_2f8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                      *)local_280);
          if (((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1] < lVar36) ||
             ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2] < lVar28)) goto LAB_00674d0a;
          pdVar26 = (double *)
                    ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                            local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[0])->
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                           m_data.array +
                    (long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[2] * lVar35);
          lVar29 = 0x10;
          do {
            dVar43 = *(double *)((long)adStack_308 + lVar29 + 8);
            pdVar17 = (double *)((long)pdVar26 + lVar35 + 0x18);
            dVar44 = pdVar17[1];
            pdVar1 = (double *)((long)pdVar26 + lVar35 + 0x18);
            *pdVar1 = *(double *)((long)adStack_308 + lVar29) + *pdVar17;
            pdVar1[1] = dVar43 + dVar44;
            *(double *)((long)pdVar26 + lVar35 + 0x28) =
                 *(double *)(local_2f8 + lVar29) + *(double *)((long)pdVar26 + lVar35 + 0x28);
            lVar29 = lVar29 + 0x18;
            pdVar26 = pdVar26 + (long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data.array[2];
          } while (lVar29 != 0x58);
          if (((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1] < lVar28) ||
             ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2] < lVar36)) goto LAB_00674d0a;
          pdVar26 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                     local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0])->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                    m_storage.m_data.array +
                    local_630._0_8_ +
                    local_620._0_8_ *
                    (long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[2];
          if (((ChMatrixConstRef)
               local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] != (ChMatrixConstRef)0x0) &&
             ((ChMatrix33<double> *)local_2f8 == (ChMatrix33<double> *)pdVar26)) {
            __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Transpose.h",0x1b6,
                          "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>, MightHaveTransposeAliasing = true]"
                         );
          }
          *pdVar26 = (double)local_2f8._0_8_ + *pdVar26;
          pdVar26[1] = (double)local_2e0.m_value + pdVar26[1];
          pdVar26[2] = local_2c8 + pdVar26[2];
          pdVar26[(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2]] =
               (double)local_2f8._8_8_ +
               pdVar26[(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[2]];
          pdVar26[(long)((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[2] + 1)] =
               local_2d8 +
               pdVar26[(long)((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                    m_storage.m_data.array[2] + 1)];
          pdVar26[(long)((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[2] + 2)] =
               (double)local_2c0 +
               pdVar26[(long)((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                    m_storage.m_data.array[2] + 2)];
          pdVar26[(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] * 2] =
               (double)local_2e8.m_value +
               pdVar26[(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[2] * 2];
          pdVar26[(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] * 2 + 1] =
               (double)local_2d0 +
               pdVar26[(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[2] * 2 + 1];
          pdVar26[(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] * 2 + 2] =
               (double)local_2b8 +
               pdVar26[(long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[2] * 2 + 2];
          uVar37 = uVar37 + 1;
          lVar35 = lVar35 + 0x30;
          pRVar31 = (ChMatrixConstRef)
                    &(local_380->m_object).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_rows;
        } while (uVar37 < (ulong)((long)(local_5b8->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_5b8->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      local_280._0_8_ =
           (((Matrix<double,_3,_3,_1,_3,_3> *)
            &local_5f8->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array
           [0];
      dStack_250 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                    &local_5f8->
                     super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                   m_data.array[3];
      local_280._8_8_ = (scalar_constant_op<double> *)0xc;
      local_280._16_8_ = (ChMatrixConstRef)0xc;
      local_280._24_8_ = local_5f8;
      vStack_260.m_value = 0;
      pStack_258.data = (double *)0x0;
      if (((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                  &local_5f8->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                 array[1] < 0xc) ||
         ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                 &local_5f8->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                array[2] < 0xc)) {
LAB_00674d81:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_590.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)
                local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [0];
      local_590.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value =
           (long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
      if (((ChMatrixConstRef)
           local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
           (ChMatrixConstRef)0xc) ||
         ((ChMatrixConstRef)
          local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] !=
          (ChMatrixConstRef)0xc)) {
        pcVar27 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
        ;
LAB_00674e6f:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar27);
      }
      local_3d0._0_8_ = &local_128;
      local_3d0._8_8_ = &local_590;
      local_3d0._16_8_ = local_5b0;
      local_3d0._24_8_ = local_280;
      local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_280._0_8_;
      local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           dStack_250;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)local_3d0);
      if ((ChMatrixConstRef)
          local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] !=
          (ChMatrixConstRef)0x0) {
        free((void *)(((ChMatrixConstRef)
                      ((long)local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[0] + -0x40))->m_object).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_cols);
      }
    }
    return;
  }
  if (this->use_numerical_diff_for_KR == true) {
    local_650.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_650.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_650,0xc);
    local_660._0_8_ = (double *)0x0;
    local_660._8_8_ = (ChMatrix33<double> **)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_660,0xc);
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[10]
    )(this,&local_650);
    local_590.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)0x0;
    local_590.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_rows.m_value = 0;
    local_590.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_cols.m_value = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&local_590,0x90,0xc,0xc);
    psVar24 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar13 = (psVar24->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    p_Var14 = (psVar24->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    local_630._0_8_ = *(undefined8 *)&(peVar13->super_ChNodeFEAbase).field_0x20;
    local_620._0_8_ = *(undefined8 *)&peVar13->field_0x28;
    local_380 = *(ChMatrixConstRef *)&peVar13->field_0x30;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
    psVar24 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar13 = (psVar24->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    p_Var14 = (psVar24->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    local_3d0._0_8_ = *(ChMatrixConstRef *)&peVar13->field_0x38;
    local_3d0._8_8_ = *(ChMatrixConstRef *)&peVar13->field_0x40;
    local_3d0._16_8_ = *(double *)&peVar13->field_0x48;
    local_3d0._24_8_ = *(double *)&peVar13->field_0x50;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
    psVar24 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar13 = psVar24[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var14 = psVar24[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    local_2a0 = *(ChMatrixConstRef *)&(peVar13->super_ChNodeFEAbase).field_0x20;
    local_5d0 = *(ChMatrixConstRef *)&peVar13->field_0x28;
    local_508 = *(ChMatrixConstRef *)&peVar13->field_0x30;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
    psVar24 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar13 = psVar24[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var14 = psVar24[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         *(double *)&peVar13->field_0x38;
    local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         *(double *)&peVar13->field_0x40;
    local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         *(double *)&peVar13->field_0x48;
    local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         *(double *)&peVar13->field_0x50;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
    lVar35 = 0;
    lVar36 = 0;
    do {
      local_500._0_8_ = local_630._0_8_;
      local_500._8_8_ = local_620._0_8_;
      sStack_4f0.m_other = (double)local_380;
      *(double *)(local_500 + lVar36 * 8) = *(double *)(local_500 + lVar36 * 8) + 1e-05;
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var14 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var14 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        *(undefined8 *)&(peVar13->super_ChNodeFEAbase).field_0x20 = local_500._0_8_;
        *(undefined8 *)&peVar13->field_0x28 = local_500._8_8_;
        *(double *)&peVar13->field_0x30 = sStack_4f0.m_other;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
        *(undefined8 *)&(peVar13->super_ChNodeFEAbase).field_0x20 = local_500._0_8_;
        *(undefined8 *)&peVar13->field_0x28 = local_500._8_8_;
        *(double *)&peVar13->field_0x30 = sStack_4f0.m_other;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
      }
      (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
        [10])(this,local_660);
      if ((pointer)local_660._8_8_ !=
          local_650.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00674ceb;
      if ((long)local_650.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish < 0) goto LAB_00674cb5;
      if ((local_590.
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < 0xc) ||
         (local_590.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar36)) goto LAB_00674cd4;
      if (local_650.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != (ChMatrix33<double> **)0xc)
      goto LAB_00674c96;
      pdVar26 = (double *)
                ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                        local_590.
                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                        .
                        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                        .m_data)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                       m_storage.m_data.array + lVar35);
      lVar29 = 0;
      do {
        *pdVar26 = (*(double *)(local_660._0_8_ + lVar29 * 8) -
                   *(double *)
                    ((long)local_650.
                           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar29 * 8)) / 1e-05;
        lVar29 = lVar29 + 1;
        pdVar26 = pdVar26 + local_590.
                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                            .
                            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                            .m_cols.m_value;
      } while (lVar29 != 0xc);
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var14 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var14 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        *(undefined8 *)&(peVar13->super_ChNodeFEAbase).field_0x20 = local_630._0_8_;
        *(undefined8 *)&peVar13->field_0x28 = local_620._0_8_;
        *(ChMatrixConstRef *)&peVar13->field_0x30 = local_380;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
        *(undefined8 *)&(peVar13->super_ChNodeFEAbase).field_0x20 = local_630._0_8_;
        *(undefined8 *)&peVar13->field_0x28 = local_620._0_8_;
        *(ChMatrixConstRef *)&peVar13->field_0x30 = local_380;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
      }
      lVar36 = lVar36 + 1;
      lVar35 = lVar35 + 8;
    } while (lVar36 != 3);
    lVar36 = 0x18;
    lVar35 = 0;
    do {
      local_280._0_8_ = VNULL;
      local_280._8_8_ = DAT_00b90ac0;
      local_280._16_8_ = DAT_00b90ac8;
      *(undefined8 *)(local_280 + lVar35 * 8) = 0x3f50624dd2f1a9fc;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_280._0_8_;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = (double)local_280._8_8_ * (double)local_280._8_8_;
      auVar81 = vfmadd231sd_fma(auVar54,auVar63,auVar63);
      auVar83._8_8_ = 0;
      auVar83._0_8_ = local_280._16_8_;
      auVar81 = vfmadd231sd_fma(auVar81,auVar83,auVar83);
      dVar44 = auVar81._0_8_;
      auVar48 = ZEXT816(0x3ff0000000000000);
      pDVar60 = (DstEvaluatorType *)local_280._0_8_;
      psVar71 = (scalar_constant_op<double> *)local_280._8_8_;
      dVar43 = 0.5;
      pRVar31 = (ChMatrixConstRef)local_280._16_8_;
      if (1e-30 < dVar44) {
        local_380 = (ChMatrixConstRef)local_280._16_8_;
        local_620._0_8_ = local_280._8_8_;
        local_630._0_8_ = local_280._0_8_;
        if (dVar44 < 0.0) {
          local_510 = sqrt(dVar44);
        }
        else {
          auVar81 = vsqrtsd_avx(auVar81,auVar81);
          local_510 = auVar81._0_8_;
        }
        local_130 = local_510 * 0.5;
        dVar43 = sin(local_130);
        local_510 = dVar43 / local_510;
        auVar38._0_8_ = cos(local_130);
        auVar38._8_56_ = extraout_var;
        auVar48 = auVar38._0_16_;
        pDVar60 = (DstEvaluatorType *)local_630._0_8_;
        psVar71 = (scalar_constant_op<double> *)local_620._0_8_;
        dVar43 = local_510;
        pRVar31 = local_380;
      }
      auVar84._8_8_ = 0;
      auVar84._0_8_ = local_3d0._0_8_;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = local_3d0._8_8_;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = (double)pDVar60 * dVar43 * (double)local_3d0._8_8_;
      auVar81 = vfmsub231sd_fma(auVar94,auVar84,auVar48);
      auVar99._8_8_ = 0;
      auVar99._0_8_ = local_3d0._16_8_;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = (double)psVar71 * dVar43;
      auVar81 = vfnmadd231sd_fma(auVar81,auVar99,auVar64);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = local_3d0._24_8_;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = (double)pRVar31 * dVar43;
      auVar45 = vfnmadd231sd_fma(auVar81,auVar103,auVar76);
      dVar44 = auVar48._0_8_;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = (double)pDVar60 * dVar43;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = dVar44 * (double)local_3d0._8_8_;
      auVar81 = vfmadd231sd_fma(auVar107,auVar84,auVar55);
      auVar81 = vfnmadd231sd_fma(auVar81,auVar103,auVar64);
      auVar81 = vfmadd231sd_fma(auVar81,auVar99,auVar76);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = (double)psVar71 * dVar43;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = dVar44 * (double)local_3d0._16_8_;
      auVar48 = vfmadd231sd_fma(auVar111,auVar84,auVar65);
      auVar48 = vfmadd231sd_fma(auVar48,auVar103,auVar55);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = (double)pRVar31 * dVar43;
      auVar105 = vfnmadd231sd_fma(auVar48,auVar90,auVar77);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = (double)local_3d0._24_8_ * dVar44;
      auVar48 = vfmadd231sd_fma(auVar49,auVar84,auVar77);
      auVar48 = vfnmadd231sd_fma(auVar48,auVar99,auVar55);
      auVar48 = vfmadd231sd_fma(auVar48,auVar90,auVar65);
      local_500._0_8_ = auVar45._0_8_;
      local_500._8_8_ = auVar81._0_8_;
      sStack_4f0.m_other = auVar105._0_8_;
      sStack_4e8.m_other = auVar48._0_8_;
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var14 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      ChFrame<double>::SetRot
                ((ChFrame<double> *)&(peVar13->super_ChNodeFEAbase).field_0x18,
                 (ChQuaternion<double> *)local_500);
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
        [10])(this,local_660);
      if ((pointer)local_660._8_8_ !=
          local_650.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00674ceb;
      if ((long)local_650.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish < 0) goto LAB_00674cb5;
      if ((local_590.
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < 0xc) ||
         (local_590.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar35 + 3)) goto LAB_00674cd4;
      if (local_650.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != (ChMatrix33<double> **)0xc)
      goto LAB_00674c96;
      pdVar26 = (double *)
                ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                        local_590.
                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                        .
                        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                        .m_data)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                       m_storage.m_data.array + lVar36);
      lVar29 = 0;
      do {
        *pdVar26 = (*(double *)(local_660._0_8_ + lVar29 * 8) -
                   *(double *)
                    ((long)local_650.
                           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar29 * 8)) / 0.001;
        lVar29 = lVar29 + 1;
        pdVar26 = pdVar26 + local_590.
                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                            .
                            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                            .m_cols.m_value;
      } while (lVar29 != 0xc);
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var14 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      ChFrame<double>::SetRot
                ((ChFrame<double> *)&(peVar13->super_ChNodeFEAbase).field_0x18,
                 (ChQuaternion<double> *)local_3d0);
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      lVar35 = lVar35 + 1;
      lVar36 = lVar36 + 8;
    } while (lVar35 != 3);
    lVar35 = 0x30;
    lVar36 = 0;
    do {
      local_500._0_8_ = local_2a0;
      local_500._8_8_ = local_5d0;
      sStack_4f0.m_other = (double)local_508;
      *(double *)(local_500 + lVar36 * 8) = *(double *)(local_500 + lVar36 * 8) + 1e-05;
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var14 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        *(undefined8 *)&(peVar13->super_ChNodeFEAbase).field_0x20 = local_500._0_8_;
        *(undefined8 *)&peVar13->field_0x28 = local_500._8_8_;
        *(double *)&peVar13->field_0x30 = sStack_4f0.m_other;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
        *(undefined8 *)&(peVar13->super_ChNodeFEAbase).field_0x20 = local_500._0_8_;
        *(undefined8 *)&peVar13->field_0x28 = local_500._8_8_;
        *(double *)&peVar13->field_0x30 = sStack_4f0.m_other;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
      }
      (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
        [10])(this,local_660);
      if ((pointer)local_660._8_8_ !=
          local_650.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00674ceb;
      if ((long)local_650.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish < 0) goto LAB_00674cb5;
      if ((local_590.
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < 0xc) ||
         (local_590.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar36 + 6)) goto LAB_00674cd4;
      if (local_650.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != (ChMatrix33<double> **)0xc)
      goto LAB_00674c96;
      pdVar26 = (double *)
                ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                        local_590.
                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                        .
                        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                        .m_data)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                       m_storage.m_data.array + lVar35);
      lVar29 = 0;
      do {
        *pdVar26 = (*(double *)(local_660._0_8_ + lVar29 * 8) -
                   *(double *)
                    ((long)local_650.
                           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar29 * 8)) / 1e-05;
        lVar29 = lVar29 + 1;
        pdVar26 = pdVar26 + local_590.
                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                            .
                            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                            .m_cols.m_value;
      } while (lVar29 != 0xc);
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var14 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        *(ChMatrixConstRef *)&(peVar13->super_ChNodeFEAbase).field_0x20 = local_2a0;
        *(ChMatrixConstRef *)&peVar13->field_0x28 = local_5d0;
        *(ChMatrixConstRef *)&peVar13->field_0x30 = local_508;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
        *(ChMatrixConstRef *)&(peVar13->super_ChNodeFEAbase).field_0x20 = local_2a0;
        *(ChMatrixConstRef *)&peVar13->field_0x28 = local_5d0;
        *(ChMatrixConstRef *)&peVar13->field_0x30 = local_508;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
      }
      lVar36 = lVar36 + 1;
      lVar35 = lVar35 + 8;
    } while (lVar36 != 3);
    lVar35 = 0x48;
    lVar36 = 0;
    do {
      local_280._0_8_ = VNULL;
      local_280._8_8_ = DAT_00b90ac0;
      local_280._16_8_ = DAT_00b90ac8;
      *(undefined8 *)(local_280 + lVar36 * 8) = 0x3f50624dd2f1a9fc;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_280._0_8_;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = (double)local_280._8_8_ * (double)local_280._8_8_;
      auVar81 = vfmadd231sd_fma(auVar56,auVar66,auVar66);
      auVar85._8_8_ = 0;
      auVar85._0_8_ = local_280._16_8_;
      auVar81 = vfmadd231sd_fma(auVar81,auVar85,auVar85);
      dVar43 = auVar81._0_8_;
      auVar48 = ZEXT816(0x3ff0000000000000);
      pDVar60 = (DstEvaluatorType *)local_280._0_8_;
      psVar71 = (scalar_constant_op<double> *)local_280._8_8_;
      pRVar31 = (ChMatrixConstRef)0x3fe0000000000000;
      pRVar23 = (ChMatrixConstRef)local_280._16_8_;
      if (1e-30 < dVar43) {
        local_380 = (ChMatrixConstRef)local_280._16_8_;
        local_620._0_8_ = local_280._8_8_;
        local_630._0_8_ = local_280._0_8_;
        if (dVar43 < 0.0) {
          local_5d0 = (ChMatrixConstRef)sqrt(dVar43);
        }
        else {
          auVar81 = vsqrtsd_avx(auVar81,auVar81);
          local_5d0 = auVar81._0_8_;
        }
        local_2a0 = (ChMatrixConstRef)((double)local_5d0 * 0.5);
        dVar43 = sin((double)local_2a0);
        local_5d0 = (ChMatrixConstRef)(dVar43 / (double)local_5d0);
        auVar39._0_8_ = cos((double)local_2a0);
        auVar39._8_56_ = extraout_var_00;
        auVar48 = auVar39._0_16_;
        pDVar60 = (DstEvaluatorType *)local_630._0_8_;
        psVar71 = (scalar_constant_op<double> *)local_620._0_8_;
        pRVar31 = local_5d0;
        pRVar23 = local_380;
      }
      auVar86._8_8_ = 0;
      auVar86._0_8_ =
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar91._8_8_ = 0;
      auVar91._0_8_ =
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar95._8_8_ = 0;
      auVar95._0_8_ =
           (double)pDVar60 * (double)pRVar31 *
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar81 = vfmsub231sd_fma(auVar95,auVar86,auVar48);
      auVar100._8_8_ = 0;
      auVar100._0_8_ =
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar67._8_8_ = 0;
      auVar67._0_8_ = (double)psVar71 * (double)pRVar31;
      auVar81 = vfnmadd231sd_fma(auVar81,auVar100,auVar67);
      auVar104._8_8_ = 0;
      auVar104._0_8_ =
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar78._8_8_ = 0;
      auVar78._0_8_ = (double)pRVar23 * (double)pRVar31;
      auVar45 = vfnmadd231sd_fma(auVar81,auVar104,auVar78);
      dVar43 = auVar48._0_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = (double)pDVar60 * (double)pRVar31;
      auVar108._8_8_ = 0;
      auVar108._0_8_ =
           dVar43 * local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[1];
      auVar81 = vfmadd231sd_fma(auVar108,auVar86,auVar57);
      auVar81 = vfnmadd231sd_fma(auVar81,auVar104,auVar67);
      auVar81 = vfmadd231sd_fma(auVar81,auVar100,auVar78);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = (double)psVar71 * (double)pRVar31;
      auVar112._8_8_ = 0;
      auVar112._0_8_ =
           dVar43 * local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2];
      auVar48 = vfmadd231sd_fma(auVar112,auVar86,auVar68);
      auVar48 = vfmadd231sd_fma(auVar48,auVar104,auVar57);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = (double)pRVar23 * (double)pRVar31;
      auVar105 = vfnmadd231sd_fma(auVar48,auVar91,auVar79);
      auVar50._8_8_ = 0;
      auVar50._0_8_ =
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
           dVar43;
      auVar48 = vfmadd231sd_fma(auVar50,auVar86,auVar79);
      auVar48 = vfnmadd231sd_fma(auVar48,auVar100,auVar57);
      auVar48 = vfmadd231sd_fma(auVar48,auVar91,auVar68);
      local_500._0_8_ = auVar45._0_8_;
      local_500._8_8_ = auVar81._0_8_;
      sStack_4f0.m_other = auVar105._0_8_;
      sStack_4e8.m_other = auVar48._0_8_;
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      ChFrame<double>::SetRot
                ((ChFrame<double> *)&(peVar13->super_ChNodeFEAbase).field_0x18,
                 (ChQuaternion<double> *)local_500);
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
        [10])(this,local_660);
      if ((pointer)local_660._8_8_ !=
          local_650.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00674ceb;
      if ((long)local_650.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish < 0) goto LAB_00674cb5;
      if ((local_590.
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < 0xc) ||
         (local_590.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar36 + 9)) goto LAB_00674cd4;
      if (local_650.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != (ChMatrix33<double> **)0xc)
      goto LAB_00674c96;
      pdVar26 = (double *)
                ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                        local_590.
                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                        .
                        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                        .m_data)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                       m_storage.m_data.array + lVar35);
      lVar29 = 0;
      do {
        *pdVar26 = (*(double *)(local_660._0_8_ + lVar29 * 8) -
                   *(double *)
                    ((long)local_650.
                           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar29 * 8)) / 0.001;
        lVar29 = lVar29 + 1;
        pdVar26 = pdVar26 + local_590.
                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                            .
                            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                            .m_cols.m_value;
      } while (lVar29 != 0xc);
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      ChFrame<double>::SetRot
                ((ChFrame<double> *)&(peVar13->super_ChNodeFEAbase).field_0x18,
                 (ChQuaternion<double> *)&local_128);
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      lVar36 = lVar36 + 1;
      lVar35 = lVar35 + 8;
    } while (lVar36 != 3);
    if (-1 < (local_590.
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              .
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value |
             local_590.
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             .
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value)) {
      local_500._0_8_ =
           (((Matrix<double,_3,_3,_1,_3,_3> *)
            &local_5f8->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array
           [0];
      vStack_4d0.m_value =
           (long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                  &local_5f8->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                 array[3];
      local_500._8_8_ = (ChMatrixConstRef)0xc;
      sStack_4f0.m_other = 5.92878775009496e-323;
      sStack_4e8.m_other = (double)local_5f8;
      local_4e0 = (ChMatrixDynamic<> *)0x0;
      vStack_4d8.m_value = 0;
      if (((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                  &local_5f8->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                 array[1] < 0xc) ||
         ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                 &local_5f8->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                array[2] < 0xc)) goto LAB_00674d81;
      local_280._16_8_ =
           local_590.
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_280._24_8_ =
           local_590.
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_cols.m_value;
      vStack_260.m_value = (long)local_540;
      if (((ChMatrixConstRef)
           local_590.
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value != (ChMatrixConstRef)0xc) ||
         ((ChMatrixConstRef)
          local_590.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value != (ChMatrixConstRef)0xc)) {
LAB_00674e40:
        vStack_4d8.m_value = 0;
        local_4e0 = (ChMatrixDynamic<> *)0x0;
        sStack_4f0.m_other = 5.92878775009496e-323;
        local_500._8_8_ = (ChMatrixConstRef)0xc;
        pcVar27 = 
        "void Eigen::DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>]"
        ;
        local_5f8 = (ChMatrixConstRef)sStack_4e8.m_other;
LAB_00674cab:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,pcVar27);
      }
      local_2f8._0_8_ = &local_350;
      local_2f8._8_8_ = local_280;
      local_2e8.m_value = (long)local_5b0;
      local_2e0.m_value = (long)local_500;
      local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_500._0_8_;
      local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)vStack_4d0.m_value;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_2f8);
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var14 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      local_5b0._0_8_ = *(undefined8 *)&peVar13->field_0xa0;
      local_5b0._8_8_ = *(undefined8 *)&peVar13->field_0xa8;
      local_5b0._16_8_ = *(undefined8 *)&peVar13->field_0xb0;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var14 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      ChFrameMoving<double>::GetWvel_loc
                ((ChFrameMoving<double> *)&(peVar13->super_ChNodeFEAbase).field_0x18);
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      local_610.m_data = *(double **)&peVar13->field_0xa0;
      local_610.m_rows = *(Index *)&peVar13->field_0xa8;
      local_610.m_cols = *(Index *)&peVar13->field_0xb0;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      ChFrameMoving<double>::GetWvel_loc
                ((ChFrameMoving<double> *)&(peVar13->super_ChNodeFEAbase).field_0x18);
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      lVar36 = 0;
      lVar35 = 0;
      do {
        local_500._0_8_ = local_5b0._0_8_;
        local_500._8_8_ = local_5b0._8_8_;
        sStack_4f0.m_other = (double)local_5b0._16_8_;
        *(double *)(local_500 + lVar35 * 8) = *(double *)(local_500 + lVar35 * 8) + 1e-05;
        psVar24 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar13 = (psVar24->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        p_Var14 = (psVar24->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        (**(code **)(*(long *)&(peVar13->super_ChNodeFEAbase).field_0x18 + 0x38))
                  (&(peVar13->super_ChNodeFEAbase).field_0x18,local_500);
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
          [10])(this,local_660);
        if ((pointer)local_660._8_8_ !=
            local_650.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00674ceb;
        if ((long)local_650.
                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish < 0) goto LAB_00674cb5;
        if ((local_590.
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             .
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value < 0xc) ||
           (local_590.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar35)) goto LAB_00674cd4;
        if (local_650.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != (ChMatrix33<double> **)0xc)
        goto LAB_00674c96;
        pdVar26 = (double *)
                  ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                          local_590.
                          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                          .
                          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                          .m_data)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                         m_storage.m_data.array + lVar36);
        lVar29 = 0;
        do {
          *pdVar26 = (*(double *)(local_660._0_8_ + lVar29 * 8) -
                     *(double *)
                      ((long)local_650.
                             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar29 * 8)) / 1e-05;
          lVar29 = lVar29 + 1;
          pdVar26 = pdVar26 + local_590.
                              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              .
                              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                              .m_cols.m_value;
        } while (lVar29 != 0xc);
        psVar24 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar13 = (psVar24->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        p_Var14 = (psVar24->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        (**(code **)(*(long *)&(peVar13->super_ChNodeFEAbase).field_0x18 + 0x38))
                  (&(peVar13->super_ChNodeFEAbase).field_0x18,local_5b0);
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        lVar35 = lVar35 + 1;
        lVar36 = lVar36 + 8;
      } while (lVar35 != 3);
      lVar36 = 0x18;
      lVar35 = 0;
      do {
        local_500._0_8_ = local_530.m_data;
        local_500._8_8_ = local_530.m_rows;
        sStack_4f0.m_other = (double)local_530.m_cols;
        *(double *)(local_500 + lVar35 * 8) = *(double *)(local_500 + lVar35 * 8) + 0.001;
        psVar24 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar13 = (psVar24->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        p_Var14 = (psVar24->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        (**(code **)(*(long *)&(peVar13->super_ChNodeFEAbase).field_0x18 + 0x48))
                  (&(peVar13->super_ChNodeFEAbase).field_0x18,local_500);
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
          [10])(this,local_660);
        if ((pointer)local_660._8_8_ !=
            local_650.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00674ceb;
        if ((long)local_650.
                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish < 0) goto LAB_00674cb5;
        if ((local_590.
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             .
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value < 0xc) ||
           (local_590.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar35 + 3)) goto LAB_00674cd4;
        if (local_650.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != (ChMatrix33<double> **)0xc)
        goto LAB_00674c96;
        pdVar26 = (double *)
                  ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                          local_590.
                          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                          .
                          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                          .m_data)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                         m_storage.m_data.array + lVar36);
        lVar29 = 0;
        do {
          *pdVar26 = (*(double *)(local_660._0_8_ + lVar29 * 8) -
                     *(double *)
                      ((long)local_650.
                             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar29 * 8)) / 0.001;
          lVar29 = lVar29 + 1;
          pdVar26 = pdVar26 + local_590.
                              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              .
                              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                              .m_cols.m_value;
        } while (lVar29 != 0xc);
        psVar24 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar13 = (psVar24->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        p_Var14 = (psVar24->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        (**(code **)(*(long *)&(peVar13->super_ChNodeFEAbase).field_0x18 + 0x48))
                  (&(peVar13->super_ChNodeFEAbase).field_0x18,&local_530);
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        lVar35 = lVar35 + 1;
        lVar36 = lVar36 + 8;
      } while (lVar35 != 3);
      lVar36 = 0x30;
      lVar35 = 0;
      do {
        local_500._0_8_ = local_610.m_data;
        local_500._8_8_ = local_610.m_rows;
        sStack_4f0.m_other = (double)local_610.m_cols;
        *(double *)(local_500 + lVar35 * 8) = *(double *)(local_500 + lVar35 * 8) + 1e-05;
        psVar24 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar13 = psVar24[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var14 = psVar24[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        (**(code **)(*(long *)&(peVar13->super_ChNodeFEAbase).field_0x18 + 0x38))
                  (&(peVar13->super_ChNodeFEAbase).field_0x18,local_500);
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
          [10])(this,local_660);
        if ((pointer)local_660._8_8_ !=
            local_650.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00674ceb;
        if ((long)local_650.
                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish < 0) goto LAB_00674cb5;
        if ((local_590.
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             .
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value < 0xc) ||
           (local_590.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar35 + 6)) goto LAB_00674cd4;
        if (local_650.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != (ChMatrix33<double> **)0xc)
        goto LAB_00674c96;
        pdVar26 = (double *)
                  ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                          local_590.
                          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                          .
                          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                          .m_data)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                         m_storage.m_data.array + lVar36);
        lVar29 = 0;
        do {
          *pdVar26 = (*(double *)(local_660._0_8_ + lVar29 * 8) -
                     *(double *)
                      ((long)local_650.
                             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar29 * 8)) / 1e-05;
          lVar29 = lVar29 + 1;
          pdVar26 = pdVar26 + local_590.
                              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              .
                              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                              .m_cols.m_value;
        } while (lVar29 != 0xc);
        psVar24 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar13 = psVar24[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var14 = psVar24[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        (**(code **)(*(long *)&(peVar13->super_ChNodeFEAbase).field_0x18 + 0x38))
                  (&(peVar13->super_ChNodeFEAbase).field_0x18,&local_610);
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        lVar35 = lVar35 + 1;
        lVar36 = lVar36 + 8;
      } while (lVar35 != 3);
      lVar36 = 0x48;
      lVar35 = 0;
      do {
        local_500._0_8_ = local_5f0.m_data;
        local_500._8_8_ = local_5f0.m_rows;
        sStack_4f0.m_other = (double)local_5f0.m_cols;
        *(double *)(local_500 + lVar35 * 8) = *(double *)(local_500 + lVar35 * 8) + 0.001;
        psVar24 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar13 = psVar24[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var14 = psVar24[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        (**(code **)(*(long *)&(peVar13->super_ChNodeFEAbase).field_0x18 + 0x48))
                  (&(peVar13->super_ChNodeFEAbase).field_0x18,local_500);
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
          [10])(this,local_660);
        if ((pointer)local_660._8_8_ !=
            local_650.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00674ceb;
        if ((long)local_650.
                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish < 0) goto LAB_00674cb5;
        if ((local_590.
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             .
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value < 0xc) ||
           (local_590.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar35 + 9)) goto LAB_00674cd4;
        if (local_650.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != (ChMatrix33<double> **)0xc)
        goto LAB_00674c96;
        pdVar26 = (double *)
                  ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                          local_590.
                          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                          .
                          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                          .m_data)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                         m_storage.m_data.array + lVar36);
        lVar29 = 0;
        do {
          *pdVar26 = (*(double *)(local_660._0_8_ + lVar29 * 8) -
                     *(double *)
                      ((long)local_650.
                             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar29 * 8)) / 0.001;
          lVar29 = lVar29 + 1;
          pdVar26 = pdVar26 + local_590.
                              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              .
                              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                              .m_cols.m_value;
        } while (lVar29 != 0xc);
        psVar24 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar13 = psVar24[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var14 = psVar24[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        (**(code **)(*(long *)&(peVar13->super_ChNodeFEAbase).field_0x18 + 0x48))
                  (&(peVar13->super_ChNodeFEAbase).field_0x18,&local_5f0);
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        lVar35 = lVar35 + 1;
        lVar36 = lVar36 + 8;
      } while (lVar35 != 3);
      if (-1 < (local_590.
                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                .
                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value |
               local_590.
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               .
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_rows.m_value)) {
        local_500._0_8_ =
             (((Matrix<double,_3,_3,_1,_3,_3> *)
              &local_5f8->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
             array[0];
        vStack_4d0.m_value =
             (long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                    &local_5f8->
                     super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                   m_data.array[3];
        local_500._8_8_ = (ChMatrixConstRef)0xc;
        sStack_4f0.m_other = 5.92878775009496e-323;
        sStack_4e8.m_other = (double)local_5f8;
        local_4e0 = (ChMatrixDynamic<> *)0x0;
        vStack_4d8.m_value = 0;
        if (((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                    &local_5f8->
                     super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                   m_data.array[1] < 0xc) ||
           ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                   &local_5f8->
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data
                  .array[2] < 0xc)) goto LAB_00674d81;
        local_280._16_8_ =
             local_590.
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             .
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
        local_280._24_8_ =
             local_590.
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             .
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value;
        vStack_260.m_value = (long)local_638;
        if (((ChMatrixConstRef)
             local_590.
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             .
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value != (ChMatrixConstRef)0xc) ||
           ((ChMatrixConstRef)
            local_590.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value != (ChMatrixConstRef)0xc)) {
          pcVar27 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
          ;
          goto LAB_00674e6f;
        }
        local_2e8.m_value = (long)&local_661;
        local_2e0.m_value = (long)local_500;
        local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
             (double)local_500._0_8_;
        local_350.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
             (double)vStack_4d0.m_value;
        local_2f8._0_8_ = (ChMatrixConstRef)&local_350;
        local_2f8._8_8_ = local_280;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
               *)local_2f8);
        if ((ChMatrixConstRef)
            local_590.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data != (ChMatrixConstRef)0x0) {
          free((void *)(((ChMatrixConstRef)
                        ((long)local_590.
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                               .
                               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                               .m_data + -0x40))->m_object).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols);
        }
        pRVar31 = (ChMatrixConstRef)
                  local_650.
                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((double *)local_660._0_8_ != (double *)0x0) {
          free(*(void **)(local_660._0_8_ + -8));
          pRVar31 = (ChMatrixConstRef)
                    local_650.
                    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
LAB_006746e8:
        if (pRVar31 != (ChMatrixConstRef)0x0) {
          free((void *)pRVar31[-1].m_object.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols);
        }
        goto LAB_006746f9;
      }
    }
  }
  else {
    local_530.m_data = (double *)0x0;
    local_530.m_rows = 0;
    local_530.m_cols = 0;
    uStack_538 = in_XMM0_Qb;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_530,0x90,0xc,0xc);
    local_610.m_data = (double *)0x0;
    local_610.m_rows = 0;
    local_610.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_610,0x90,0xc,0xc);
    local_5f0.m_data = (double *)0x0;
    local_5f0.m_rows = 0;
    local_5f0.m_cols = 0;
    ChMatrix33<double>::ChMatrix33(&local_128,&this->q_element_abs_rot);
    psVar24 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar13 = (psVar24->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    p_Var14 = (psVar24->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    auVar45._8_8_ = 0;
    auVar45._0_8_ = *(ulong *)&peVar13->field_0x38;
    dVar43 = *(double *)&peVar13->field_0x40;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar43;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = *(double *)&peVar13->field_0x48;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = *(double *)&peVar13->field_0x50;
    dVar44 = (this->q_element_abs_rot).m_data[0];
    auVar81._8_8_ = 0;
    auVar81._0_8_ = dVar44;
    dVar2 = (this->q_element_abs_rot).m_data[1];
    auVar88._8_8_ = 0;
    auVar88._0_8_ = dVar2;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar43 * dVar2;
    auVar81 = vfmadd231sd_fma(auVar48,auVar45,auVar81);
    auVar97._8_8_ = 0;
    auVar97._0_8_ = (this->q_element_abs_rot).m_data[2];
    auVar81 = vfmadd231sd_fma(auVar81,auVar61,auVar97);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = (this->q_element_abs_rot).m_data[3];
    auVar81 = vfmadd231sd_fma(auVar81,auVar72,auVar101);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = dVar44 * dVar43;
    auVar48 = vfmsub231sd_fma(auVar105,auVar45,auVar88);
    auVar48 = vfmadd231sd_fma(auVar48,auVar72,auVar97);
    auVar105 = vfnmadd231sd_fma(auVar48,auVar61,auVar101);
    auVar109._8_8_ = 0;
    auVar109._0_8_ = dVar44 * *(double *)&peVar13->field_0x48;
    auVar48 = vfmsub231sd_fma(auVar109,auVar45,auVar97);
    auVar48 = vfnmadd231sd_fma(auVar48,auVar72,auVar88);
    auVar48 = vfmadd231sd_fma(auVar48,auVar52,auVar101);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar44 * *(double *)&peVar13->field_0x50;
    auVar45 = vfmsub231sd_fma(auVar73,auVar45,auVar101);
    auVar45 = vfmadd231sd_fma(auVar45,auVar61,auVar88);
    auVar45 = vfnmadd231sd_fma(auVar45,auVar52,auVar97);
    local_500._0_8_ = auVar81._0_8_;
    local_500._8_8_ = auVar105._0_8_;
    sStack_4f0.m_other = auVar48._0_8_;
    sStack_4e8.m_other = auVar45._0_8_;
    ChMatrix33<double>::ChMatrix33(&local_350,(ChQuaternion<double> *)local_500);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
    psVar24 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar13 = psVar24[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var14 = psVar24[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    auVar46._8_8_ = 0;
    auVar46._0_8_ = *(ulong *)&peVar13->field_0x38;
    dVar43 = *(double *)&peVar13->field_0x40;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar43;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = *(double *)&peVar13->field_0x48;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = *(double *)&peVar13->field_0x50;
    dVar44 = (this->q_element_abs_rot).m_data[0];
    auVar82._8_8_ = 0;
    auVar82._0_8_ = dVar44;
    dVar2 = (this->q_element_abs_rot).m_data[1];
    auVar89._8_8_ = 0;
    auVar89._0_8_ = dVar2;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = dVar43 * dVar2;
    auVar81 = vfmadd231sd_fma(auVar93,auVar46,auVar82);
    auVar98._8_8_ = 0;
    auVar98._0_8_ = (this->q_element_abs_rot).m_data[2];
    auVar81 = vfmadd231sd_fma(auVar81,auVar62,auVar98);
    auVar102._8_8_ = 0;
    auVar102._0_8_ = (this->q_element_abs_rot).m_data[3];
    auVar81 = vfmadd231sd_fma(auVar81,auVar74,auVar102);
    auVar106._8_8_ = 0;
    auVar106._0_8_ = dVar44 * dVar43;
    auVar48 = vfmsub231sd_fma(auVar106,auVar46,auVar89);
    auVar48 = vfmadd231sd_fma(auVar48,auVar74,auVar98);
    auVar105 = vfnmadd231sd_fma(auVar48,auVar62,auVar102);
    auVar110._8_8_ = 0;
    auVar110._0_8_ = dVar44 * *(double *)&peVar13->field_0x48;
    auVar48 = vfmsub231sd_fma(auVar110,auVar46,auVar98);
    auVar48 = vfnmadd231sd_fma(auVar48,auVar74,auVar89);
    auVar48 = vfmadd231sd_fma(auVar48,auVar53,auVar102);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar44 * *(double *)&peVar13->field_0x50;
    auVar45 = vfmsub231sd_fma(auVar75,auVar46,auVar102);
    auVar45 = vfmadd231sd_fma(auVar45,auVar62,auVar89);
    auVar45 = vfnmadd231sd_fma(auVar45,auVar53,auVar98);
    local_500._0_8_ = auVar81._0_8_;
    local_500._8_8_ = auVar105._0_8_;
    sStack_4f0.m_other = auVar48._0_8_;
    sStack_4e8.m_other = auVar45._0_8_;
    ChMatrix33<double>::ChMatrix33
              ((ChMatrix33<double> *)&local_590,(ChQuaternion<double> *)local_500);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
    local_650.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_650.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
    local_650.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
    local_500._0_8_ = &local_128;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    _M_realloc_insert<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               &local_650,(iterator)0x0,(ChMatrix33<double> **)local_500);
    if (local_650.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_650.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_500._0_8_ = &local_350;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      _M_realloc_insert<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_650,
                 (iterator)
                 local_650.
                 super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_500);
    }
    else {
      *local_650.
       super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = &local_350;
      local_650.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_650.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (local_650.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_650.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_500._0_8_ = &local_128;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      _M_realloc_insert<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_650,
                 (iterator)
                 local_650.
                 super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_500);
    }
    else {
      *local_650.
       super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = &local_128;
      local_650.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_650.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_500._0_8_ = &local_590;
    if (local_650.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_650.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      _M_realloc_insert<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_650,
                 (iterator)
                 local_650.
                 super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_500);
    }
    else {
      *local_650.
       super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> *)&local_590;
      local_650.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_650.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (this->use_geometric_stiffness == true) {
      iVar21 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                 _vptr_ChElementBase[3])(this);
      local_3d0._0_8_ = (ChMatrixConstRef)0x0;
      local_3d0._8_8_ = (ChMatrixConstRef)0x0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3d0,(long)iVar21)
      ;
      (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
        [6])(this,(RhsNested)local_3d0);
      pRVar31 = (ChMatrixConstRef)
                (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      pRVar23 = (ChMatrixConstRef)
                (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_cols;
      if ((long)pRVar23 < 0 && pRVar31 != (ChMatrixConstRef)0x0) {
        pcVar27 = 
        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
        ;
        goto LAB_00674e8e;
      }
      if ((this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows < 1) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
                     );
      }
      if (pRVar23 != (ChMatrixConstRef)local_3d0._8_8_) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                     );
      }
      local_4e0 = &this->Km;
      local_2f8._0_8_ = local_2f8 + 8;
      vStack_4d8.m_value = 0;
      vStack_4d0.m_value = 0;
      local_500._8_8_ = pRVar31;
      sStack_4e8.m_other = (double)pRVar23;
      pRStack_4c8 = pRVar23;
      pMStack_4b8 = (RhsNested)local_3d0;
      if ((ChMatrixConstRef)local_3d0._8_8_ == (ChMatrixConstRef)0x0) {
        local_2f8._8_8_ = (undefined1 *)0x0;
      }
      else {
        if ((long)local_3d0._8_8_ < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        pStack_258.data = (double *)local_3d0._0_8_;
        local_280._16_8_ = pRVar31;
        vStack_260.m_value = (long)pRVar23;
        local_2f8._8_8_ =
             Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_280,(scalar_sum_op<double,_double> *)local_5b0,
                        (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)local_500);
      }
      pRVar31 = (ChMatrixConstRef)
                (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_rows;
      pRVar23 = (ChMatrixConstRef)
                (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_cols;
      if (-1 < (long)((ulong)pRVar23 | (ulong)pRVar31)) {
        pRVar32 = (ChMatrixConstRef)
                  (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_rows;
        pRVar30 = (ChMatrixConstRef)
                  (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols;
        auVar20._8_8_ = uStack_538;
        auVar20._0_8_ = local_540;
        if (-1 < (long)((ulong)pRVar30 | (ulong)pRVar32)) {
          if ((pRVar31 != pRVar32) || (pRVar23 != pRVar30)) {
            pcVar27 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>]"
            ;
            goto LAB_00674d00;
          }
          auVar92._8_8_ = 0;
          auVar92._0_8_ =
               (((Matrix<double,_3,_3,_1,_3,_3> *)local_2f8._0_8_)->
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array
               [0];
          auVar96._8_8_ = 0;
          auVar96._0_8_ =
               ((this->section).
                super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->rdamping_beta;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_638;
          auVar81 = vfmadd132sd_fma(auVar96,auVar20,auVar4);
          pdVar26 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_data;
          pdVar17 = (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_data;
          if (((ChMatrixConstRef)local_5f0.m_rows != pRVar32) ||
             ((ChMatrixConstRef)local_5f0.m_cols != pRVar30)) {
            local_630 = auVar92;
            local_620 = auVar81;
            if ((pRVar30 != (ChMatrixConstRef)0x0 && pRVar32 != (ChMatrixConstRef)0x0) &&
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)pRVar30),0
                      ) < (long)pRVar32)) {
              puVar25 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar25 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar25,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                      (&local_5f0,(long)pRVar30 * (long)pRVar32,(Index)pRVar32,(Index)pRVar30);
            auVar81 = local_620;
            auVar92 = local_630;
          }
          if (((ChMatrixConstRef)local_5f0.m_rows != pRVar32) ||
             ((ChMatrixConstRef)local_5f0.m_cols != pRVar30)) {
            __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>>, T1 = double, T2 = double]"
                         );
          }
          uVar22 = local_5f0.m_cols * local_5f0.m_rows;
          uVar37 = uVar22 + 7;
          if (-1 < (long)uVar22) {
            uVar37 = uVar22;
          }
          uVar37 = uVar37 & 0xfffffffffffffff8;
          if (7 < (long)uVar22) {
            auVar38 = vbroadcastsd_avx512f(auVar81);
            auVar39 = vbroadcastsd_avx512f(auVar92);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_540;
            auVar40 = vbroadcastsd_avx512f(auVar5);
            lVar35 = 0;
            do {
              auVar41 = vmulpd_avx512f(auVar38,*(undefined1 (*) [64])(pdVar26 + lVar35));
              auVar42 = vmulpd_avx512f(auVar39,*(undefined1 (*) [64])(pdVar17 + lVar35));
              auVar42 = vmulpd_avx512f(auVar40,auVar42);
              auVar41 = vaddpd_avx512f(auVar41,auVar42);
              *(undefined1 (*) [64])
               ((((Matrix<double,_3,_3,_1,_3,_3> *)local_5f0.m_data)->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array
               + lVar35) = auVar41;
              lVar35 = lVar35 + 8;
            } while (lVar35 < (long)uVar37);
          }
          if ((long)uVar37 < (long)uVar22) {
            do {
              (((Matrix<double,_3,_3,_1,_3,_3> *)local_5f0.m_data)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array
              [uVar37] = auVar81._0_8_ * pdVar26[uVar37] +
                         auVar92._0_8_ * pdVar17[uVar37] * (double)local_540;
              uVar37 = uVar37 + 1;
            } while (uVar22 - uVar37 != 0);
          }
          this = local_5b8;
          if ((ChMatrixConstRef)local_3d0._0_8_ != (ChMatrixConstRef)0x0) {
            free(*(void **)(local_3d0._0_8_ + -8));
            this = local_5b8;
          }
          goto LAB_00673d86;
        }
      }
    }
    else {
      pSVar15 = (SrcEvaluatorType *)
                (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_rows;
      paVar16 = (assign_op<double,_double> *)
                (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_cols;
      if (-1 < (long)((ulong)paVar16 | (ulong)pSVar15)) {
        local_500._0_8_ = &this->Km;
        auVar47._8_8_ = 0;
        auVar47._0_8_ =
             ((this->section).
              super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->rdamping_beta;
        auVar19._8_8_ = uStack_538;
        auVar19._0_8_ = local_540;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_638;
        auVar81 = vfmadd132sd_fma(auVar47,auVar19,auVar3);
        sStack_4e8.m_other = auVar81._0_8_;
        local_500._8_8_ = pSVar15;
        sStack_4f0.m_other = (double)paVar16;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,__1,_1,__1,__1> *)&local_5f0,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                    *)local_500,(assign_op<double,_double> *)local_280);
LAB_00673d86:
        local_500._0_8_ = (ChMatrixConstRef)0x0;
        local_500._8_8_ = (ChMatrixConstRef)0x0;
        sStack_4f0.m_other = 0.0;
        sStack_4e8.m_other = 0.0;
        vStack_4d8.m_value = 0;
        vStack_4d0.m_value = 0;
        pRStack_4c8 = (ChMatrixConstRef)0x0;
        Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
        construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                   local_500,&local_5f0);
        local_a0[0].
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_a0[0].
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = local_530.m_data;
        local_a0[0].
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = local_530.m_rows;
        local_a0[0].
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = local_530.m_cols;
        if (-1 < (local_530.m_rows | local_530.m_cols) ||
            (ChMatrixConstRef)local_530.m_data == (ChMatrixConstRef)0x0) {
          local_a0[0].
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = local_530.m_cols;
          ChMatrixCorotation::ComputeCK((ChMatrixConstRef)local_500,&local_650,4,local_a0);
          if ((double)vStack_4d8.m_value != 0.0) {
            free(*(void **)(vStack_4d8.m_value + -8));
          }
          local_500._0_8_ = (ChMatrixConstRef)0x0;
          local_500._8_8_ = (ChMatrixConstRef)0x0;
          sStack_4f0.m_other = 0.0;
          sStack_4e8.m_other = 0.0;
          vStack_4d8.m_value = 0;
          vStack_4d0.m_value = 0;
          pRStack_4c8 = (ChMatrixConstRef)0x0;
          Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
          construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                     local_500,&local_530);
          local_e0.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = 0;
          local_e0.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = local_610.m_data;
          local_e0.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value = local_610.m_rows;
          local_e0.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value = local_610.m_cols;
          if (-1 < (local_610.m_rows | local_610.m_cols) ||
              (ChMatrixConstRef)local_610.m_data == (ChMatrixConstRef)0x0) {
            local_e0.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .m_stride.m_outer.m_value = local_610.m_cols;
            ChMatrixCorotation::ComputeKCt((ChMatrixConstRef)local_500,&local_650,4,&local_e0);
            if ((double)vStack_4d8.m_value != 0.0) {
              free(*(void **)(vStack_4d8.m_value + -8));
            }
            if (this->force_symmetric_stiffness == true) {
              pRVar31 = (ChMatrixConstRef)0x1;
              if (1 < local_610.m_rows) {
                pRVar31 = (ChMatrixConstRef)local_610.m_rows;
              }
              if (pRVar31 != (ChMatrixConstRef)0x1) {
                lVar35 = 0;
                puVar33 = (undefined1 *)0x0;
                pRVar23 = (ChMatrixConstRef)local_610.m_rows;
                pRVar32 = (ChMatrixConstRef)local_610.m_cols;
                do {
                  puVar33 = puVar33 + 1;
                  if ((long)puVar33 < local_610.m_cols) {
                    pRVar34 = (ChMatrixConstRef)0x1;
                    pRVar30 = (ChMatrixConstRef)local_610.m_cols;
                    do {
                      if (pRVar23 == pRVar34) {
                        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                                     );
                      }
                      *(undefined8 *)
                       ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_610.m_data)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                              m_storage.m_data.array + (long)pRVar34 * 8 + lVar35) =
                           *(undefined8 *)
                            ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_610.m_data)->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                   m_storage.m_data.array + (long)pRVar30 * 8 + lVar35);
                      pRVar34 = (ChMatrixConstRef)
                                ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                                        &pRVar34->
                                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                        )->
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>)
                                       .m_storage.m_data.array + 1);
                      pRVar30 = (ChMatrixConstRef)
                                ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                                        &pRVar30->
                                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                        )->
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>)
                                       .m_storage.m_data.array + local_610.m_cols);
                    } while (pRVar32 != pRVar34);
                  }
                  pRVar23 = (ChMatrixConstRef)
                            ((long)&pRVar23[-1].m_object.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                    .m_storage.m_cols + 7);
                  lVar35 = lVar35 + local_610.m_cols * 8 + 8;
                  pRVar32 = (ChMatrixConstRef)
                            ((long)&pRVar32[-1].m_object.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                    .m_storage.m_cols + 7);
                } while (puVar33 !=
                         (undefined1 *)
                         ((long)&pRVar31[-1].m_object.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                 m_storage.m_cols + 7));
              }
            }
            local_500._0_8_ =
                 (((Matrix<double,_3,_3,_1,_3,_3> *)
                  &local_5f8->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                 array[0];
            vStack_4d0.m_value =
                 (long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                        &local_5f8->
                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                        )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                       m_data.array[3];
            local_500._8_8_ = (ChMatrixConstRef)0xc;
            sStack_4f0.m_other = 5.92878775009496e-323;
            sStack_4e8.m_other = (double)local_5f8;
            local_4e0 = (ChMatrixDynamic<> *)0x0;
            vStack_4d8.m_value = 0;
            if (((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                        &local_5f8->
                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                        )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                       m_data.array[1] < 0xc) ||
               ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                       &local_5f8->
                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                      m_data.array[2] < 0xc)) goto LAB_00674d81;
            local_3d0._0_8_ = local_610.m_data;
            local_3d0._8_8_ = local_610.m_cols;
            if (((ChMatrixConstRef)local_610.m_rows == (ChMatrixConstRef)0xc) &&
               ((ChMatrixConstRef)local_610.m_cols == (ChMatrixConstRef)0xc)) {
              local_280._0_8_ = local_2f8;
              local_280._8_8_ = local_3d0;
              local_280._16_8_ = local_5b0;
              local_2f8._0_8_ = local_500._0_8_;
              local_2e8.m_value = vStack_4d0.m_value;
              local_280._24_8_ = (ChMatrixConstRef)local_500;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)local_280);
              peVar18 = (this->section).
                        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              if ((peVar18->compute_inertia_damping_matrix != false) ||
                 (peVar18->compute_inertia_stiffness_matrix == true)) {
                dStack_180 = 0.0;
                dStack_178 = 0.0;
                dStack_170 = 0.0;
                dStack_168 = 0.0;
                local_1c0 = 0.0;
                dStack_1b8 = 0.0;
                dStack_1b0 = 0.0;
                dStack_1a8 = 0.0;
                dStack_1a0 = 0.0;
                dStack_198 = 0.0;
                dStack_190 = 0.0;
                dStack_188 = 0.0;
                local_200 = 0.0;
                dStack_1f8 = 0.0;
                dStack_1f0 = 0.0;
                dStack_1e8 = 0.0;
                dStack_1e0 = 0.0;
                dStack_1d8 = 0.0;
                dStack_1d0 = 0.0;
                dStack_1c8 = 0.0;
                local_240 = (ChMatrixConstRef)0x0;
                dStack_238 = 0.0;
                dStack_230 = 0.0;
                dStack_228 = 0.0;
                dStack_220 = 0.0;
                dStack_218 = 0.0;
                dStack_210 = 0.0;
                dStack_208 = 0.0;
                local_280._0_8_ = (DstEvaluatorType *)0x0;
                local_280._8_8_ = (scalar_constant_op<double> *)0x0;
                local_280._16_8_ = (ChMatrixConstRef)0x0;
                local_280._24_8_ = (ChMatrixConstRef)0x0;
                vStack_260.m_value = 0;
                pStack_258.data = (double *)0x0;
                dStack_250 = 0.0;
                dStack_248 = 0.0;
                psVar24 = (this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish != psVar24) {
                  dVar43 = (this->super_ChElementBeam).length * 0.5;
                  local_2a0 = (ChMatrixConstRef)(dVar43 * (double)local_540);
                  local_380 = (ChMatrixConstRef)(dVar43 * (double)local_638);
                  pRStack_378 = local_380;
                  pRStack_370 = local_380;
                  pRStack_368 = local_380;
                  pRStack_298 = local_2a0;
                  apRStack_290[0] = local_2a0;
                  apRStack_290[1] = local_2a0;
                  local_630._0_8_ = 0x18;
                  uVar37 = 0;
                  do {
                    peVar18 = (this->section).
                              super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
                    if (peVar18->compute_inertia_damping_matrix == true) {
                      ChFrameMoving<double>::GetWvel_loc
                                ((ChFrameMoving<double> *)
                                 &((psVar24[uVar37].
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->super_ChNodeFEAbase).field_0x18);
                      (*(peVar18->super_ChBeamSection)._vptr_ChBeamSection[0xe])
                                (peVar18,local_500,local_2f8);
                      local_280._0_8_ =
                           (DstEvaluatorType *)
                           ((double)local_380 * (double)local_500._0_8_ + (double)local_280._0_8_);
                      local_280._8_8_ =
                           (scalar_constant_op<double> *)
                           ((double)pRStack_378 * (double)local_500._8_8_ + (double)local_280._8_8_)
                      ;
                      local_280._16_8_ =
                           (ChMatrixConstRef)
                           ((double)pRStack_370 * sStack_4f0.m_other + (double)local_280._16_8_);
                      local_280._24_8_ =
                           (ChMatrixConstRef)
                           ((double)pRStack_368 * sStack_4e8.m_other + (double)local_280._24_8_);
                      vStack_260.m_value =
                           (long)((double)local_380 * (double)local_4e0 + (double)vStack_260.m_value
                                 );
                      pStack_258.data =
                           (double *)
                           ((double)pRStack_378 * (double)vStack_4d8.m_value +
                           (double)pStack_258.data);
                      dStack_250 = (double)pRStack_370 * (double)vStack_4d0.m_value + dStack_250;
                      dStack_248 = (double)pRStack_368 * (double)pRStack_4c8 + dStack_248;
                      local_240 = (ChMatrixConstRef)
                                  ((double)local_380 * local_4c0 + (double)local_240);
                      dStack_238 = (double)pRStack_378 * (double)pMStack_4b8 + dStack_238;
                      dStack_230 = (double)pRStack_370 * dStack_4b0 + dStack_230;
                      dStack_228 = (double)pRStack_368 * dStack_4a8 + dStack_228;
                      dStack_220 = (double)local_380 * local_4a0 + dStack_220;
                      dStack_218 = (double)pRStack_378 * dStack_498 + dStack_218;
                      dStack_210 = (double)pRStack_370 * dStack_490 + dStack_210;
                      dStack_208 = (double)pRStack_368 * dStack_488 + dStack_208;
                      local_200 = (double)local_380 * local_480 + local_200;
                      dStack_1f8 = (double)pRStack_378 * dStack_478 + dStack_1f8;
                      dStack_1f0 = (double)pRStack_370 * dStack_470 + dStack_1f0;
                      dStack_1e8 = (double)pRStack_368 * dStack_468 + dStack_1e8;
                      dStack_1e0 = (double)local_380 * local_460 + dStack_1e0;
                      dStack_1d8 = (double)pRStack_378 * dStack_458 + dStack_1d8;
                      dStack_1d0 = (double)pRStack_370 * dStack_450 + dStack_1d0;
                      dStack_1c8 = (double)pRStack_368 * dStack_448 + dStack_1c8;
                      local_1c0 = (double)local_380 * local_440 + local_1c0;
                      dStack_1b8 = (double)pRStack_378 * dStack_438 + dStack_1b8;
                      dStack_1b0 = (double)pRStack_370 * dStack_430 + dStack_1b0;
                      dStack_1a8 = (double)pRStack_368 * dStack_428 + dStack_1a8;
                      dStack_1a0 = (double)local_380 * local_420 + dStack_1a0;
                      dStack_198 = (double)pRStack_378 * dStack_418 + dStack_198;
                      dStack_190 = (double)pRStack_370 * dStack_410 + dStack_190;
                      dStack_188 = (double)pRStack_368 * dStack_408 + dStack_188;
                      dStack_180 = (double)local_380 * local_400 + dStack_180;
                      dStack_178 = (double)pRStack_378 * dStack_3f8 + dStack_178;
                      dStack_170 = (double)pRStack_370 * dStack_3f0 + dStack_170;
                      dStack_168 = (double)pRStack_368 * dStack_3e8 + dStack_168;
                    }
                    peVar18 = (this->section).
                              super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
                    if (peVar18->compute_inertia_stiffness_matrix == true) {
                      local_620._0_8_ = uVar37;
                      ChFrameMoving<double>::GetWvel_loc
                                ((ChFrameMoving<double> *)
                                 &(((this->nodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar37].
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->super_ChNodeFEAbase).field_0x18);
                      ChFrameMoving<double>::GetWacc_loc
                                ((ChFrameMoving<double> *)
                                 &(((this->nodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar37].
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->super_ChNodeFEAbase).field_0x18);
                      peVar13 = (this->nodes).
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar37].
                                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                      auVar51._8_8_ = 0;
                      auVar51._0_8_ = *(ulong *)&peVar13->field_0xd8;
                      dVar43 = *(double *)&peVar13->field_0xe0;
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = *(ulong *)&peVar13->field_0x58;
                      auVar69._8_8_ = 0;
                      auVar69._0_8_ = dVar43 * *(double *)&peVar13->field_0x70;
                      auVar81 = vfmadd231sd_fma(auVar69,auVar51,auVar6);
                      auVar80._8_8_ = 0;
                      auVar80._0_8_ = *(ulong *)&peVar13->field_0xe8;
                      auVar7._8_8_ = 0;
                      auVar7._0_8_ = *(ulong *)&peVar13->field_0x88;
                      auVar81 = vfmadd231sd_fma(auVar81,auVar80,auVar7);
                      auVar8._8_8_ = 0;
                      auVar8._0_8_ = *(ulong *)&peVar13->field_0x60;
                      auVar87._8_8_ = 0;
                      auVar87._0_8_ = dVar43 * *(double *)&peVar13->field_0x78;
                      auVar48 = vfmadd231sd_fma(auVar87,auVar51,auVar8);
                      auVar9._8_8_ = 0;
                      auVar9._0_8_ = *(ulong *)&peVar13->field_0x90;
                      auVar48 = vfmadd231sd_fma(auVar48,auVar80,auVar9);
                      auVar10._8_8_ = 0;
                      auVar10._0_8_ = *(ulong *)&peVar13->field_0x68;
                      auVar58._8_8_ = 0;
                      auVar58._0_8_ = dVar43 * *(double *)&peVar13->field_0x80;
                      auVar45 = vfmadd231sd_fma(auVar58,auVar51,auVar10);
                      auVar11._8_8_ = 0;
                      auVar11._0_8_ = *(ulong *)&peVar13->field_0x98;
                      auVar45 = vfmadd231sd_fma(auVar45,auVar80,auVar11);
                      local_5b0._0_8_ = auVar81._0_8_;
                      local_5b0._8_8_ = auVar48._0_8_;
                      local_5b0._16_8_ = auVar45._0_8_;
                      (*(peVar18->super_ChBeamSection)._vptr_ChBeamSection[0xf])
                                (peVar18,local_500,local_2f8,local_3d0,local_5b0);
                      local_280._0_8_ =
                           (DstEvaluatorType *)
                           ((double)local_2a0 * (double)local_500._0_8_ + (double)local_280._0_8_);
                      local_280._8_8_ =
                           (scalar_constant_op<double> *)
                           ((double)pRStack_298 * (double)local_500._8_8_ + (double)local_280._8_8_)
                      ;
                      local_280._16_8_ =
                           (ChMatrixConstRef)
                           ((double)apRStack_290[0] * sStack_4f0.m_other + (double)local_280._16_8_)
                      ;
                      local_280._24_8_ =
                           (ChMatrixConstRef)
                           ((double)apRStack_290[1] * sStack_4e8.m_other + (double)local_280._24_8_)
                      ;
                      vStack_260.m_value =
                           (long)((double)local_2a0 * (double)local_4e0 + (double)vStack_260.m_value
                                 );
                      pStack_258.data =
                           (double *)
                           ((double)pRStack_298 * (double)vStack_4d8.m_value +
                           (double)pStack_258.data);
                      dStack_250 = (double)apRStack_290[0] * (double)vStack_4d0.m_value + dStack_250
                      ;
                      dStack_248 = (double)apRStack_290[1] * (double)pRStack_4c8 + dStack_248;
                      local_240 = (ChMatrixConstRef)
                                  ((double)local_2a0 * local_4c0 + (double)local_240);
                      dStack_238 = (double)pRStack_298 * (double)pMStack_4b8 + dStack_238;
                      dStack_230 = (double)apRStack_290[0] * dStack_4b0 + dStack_230;
                      dStack_228 = (double)apRStack_290[1] * dStack_4a8 + dStack_228;
                      dStack_220 = (double)local_2a0 * local_4a0 + dStack_220;
                      dStack_218 = (double)pRStack_298 * dStack_498 + dStack_218;
                      dStack_210 = (double)apRStack_290[0] * dStack_490 + dStack_210;
                      dStack_208 = (double)apRStack_290[1] * dStack_488 + dStack_208;
                      local_200 = (double)local_2a0 * local_480 + local_200;
                      dStack_1f8 = (double)pRStack_298 * dStack_478 + dStack_1f8;
                      dStack_1f0 = (double)apRStack_290[0] * dStack_470 + dStack_1f0;
                      dStack_1e8 = (double)apRStack_290[1] * dStack_468 + dStack_1e8;
                      dStack_1e0 = (double)local_2a0 * local_460 + dStack_1e0;
                      dStack_1d8 = (double)pRStack_298 * dStack_458 + dStack_1d8;
                      dStack_1d0 = (double)apRStack_290[0] * dStack_450 + dStack_1d0;
                      dStack_1c8 = (double)apRStack_290[1] * dStack_448 + dStack_1c8;
                      local_1c0 = (double)local_2a0 * local_440 + local_1c0;
                      dStack_1b8 = (double)pRStack_298 * dStack_438 + dStack_1b8;
                      dStack_1b0 = (double)apRStack_290[0] * dStack_430 + dStack_1b0;
                      dStack_1a8 = (double)apRStack_290[1] * dStack_428 + dStack_1a8;
                      dStack_1a0 = (double)local_2a0 * local_420 + dStack_1a0;
                      dStack_198 = (double)pRStack_298 * dStack_418 + dStack_198;
                      dStack_190 = (double)apRStack_290[0] * dStack_410 + dStack_190;
                      dStack_188 = (double)apRStack_290[1] * dStack_408 + dStack_188;
                      dStack_180 = (double)local_2a0 * local_400 + dStack_180;
                      dStack_178 = (double)pRStack_298 * dStack_3f8 + dStack_178;
                      dStack_170 = (double)apRStack_290[0] * dStack_3f0 + dStack_170;
                      dStack_168 = (double)apRStack_290[1] * dStack_3e8 + dStack_168;
                      uVar37 = local_620._0_8_;
                    }
                    this = local_5b8;
                    pRVar31 = local_5f8;
                    lVar36 = uVar37 * 6;
                    lVar35 = lVar36 + 6;
                    if (((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                                &local_5f8->
                                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                               m_storage.m_data.array[1] < lVar35) ||
                       ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                               &local_5f8->
                                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                               )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                              m_storage.m_data.array[2] < lVar35)) {
LAB_00674d6a:
                      pcVar27 = 
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
                      ;
                      goto LAB_00674d1f;
                    }
                    dVar43 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                              &local_5f8->
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                             m_storage.m_data.array[3];
                    pdVar26 = (double *)
                              ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                                      &local_5f8->
                                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                      )->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                     m_storage.m_data.array[0] + 0x10 +
                              ((long)dVar43 + 1) * local_630._0_8_);
                    lVar29 = 0xb8;
                    do {
                      dVar44 = *(double *)(local_280 + lVar29 + -8);
                      pdVar26[-2] = *(double *)((long)apRStack_290 + lVar29) + pdVar26[-2];
                      pdVar26[-1] = dVar44 + pdVar26[-1];
                      *pdVar26 = *(double *)(local_280 + lVar29) + *pdVar26;
                      lVar29 = lVar29 + 0x30;
                      pdVar26 = pdVar26 + (long)dVar43;
                    } while (lVar29 != 0x148);
                    if (((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                                &local_5f8->
                                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                               m_storage.m_data.array[1] < lVar36 + 3) ||
                       ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                               &local_5f8->
                                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                               )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                              m_storage.m_data.array[2] < lVar35)) goto LAB_00674d6a;
                    local_2f8._0_8_ =
                         &((local_5b8->nodes).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar37].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->field_0x58;
                    dVar43 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                              &local_5f8->
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                             m_storage.m_data.array[0];
                    dVar44 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                              &local_5f8->
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                             m_storage.m_data.array[3];
                    local_2f8._8_8_ = local_280 + 0x18;
                    local_2e0.m_value = (long)local_280;
                    local_2d8 = 0.0;
                    local_2d0 = (double *)0x3;
                    local_2c8 = 2.96439387504748e-323;
                    local_2a8 = 3;
                    local_660._0_8_ = local_3d0;
                    local_5b0._0_8_ = local_660;
                    local_5b0._8_8_ = local_2f8;
                    local_5b0._16_8_ = &local_661;
                    local_5b0._24_8_ = local_660._0_8_;
                    local_2c0 = (ChMatrixConstRef)local_2f8._0_8_;
                    local_2b8 = (undefined1 *)local_2f8._8_8_;
                    Eigen::internal::
                    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
                    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                           *)local_5b0);
                    pdVar26 = (double *)
                              ((lVar36 + 3) * 8 + (long)dVar43 + lVar36 * (long)dVar44 * 8);
                    dVar43 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                              &pRVar31->
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                             m_storage.m_data.array[3];
                    *pdVar26 = (double)local_3d0._0_8_ + *pdVar26;
                    pdVar26[1] = (double)local_3d0._24_8_ + pdVar26[1];
                    pdVar26[2] = local_3a0 + pdVar26[2];
                    pdVar26[(long)dVar43] = (double)local_3d0._8_8_ + pdVar26[(long)dVar43];
                    pdVar26[(long)dVar43 + 1] = (double)local_3d0._32_8_ + pdVar26[(long)dVar43 + 1]
                    ;
                    pdVar26[(long)dVar43 + 2] = local_398 + pdVar26[(long)dVar43 + 2];
                    pdVar26[(long)dVar43 * 2] = (double)local_3d0._16_8_ + pdVar26[(long)dVar43 * 2]
                    ;
                    pdVar26[(long)dVar43 * 2 + 1] =
                         (double)local_3a8 + pdVar26[(long)dVar43 * 2 + 1];
                    pdVar26[(long)dVar43 * 2 + 2] = local_390 + pdVar26[(long)dVar43 * 2 + 2];
                    uVar37 = uVar37 + 1;
                    psVar24 = (this->nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    local_630._0_8_ = local_630._0_8_ + 0x30;
                  } while (uVar37 < (ulong)((long)(this->nodes).
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)psVar24 >> 4));
                }
              }
              if ((ChMatrixConstRef)
                  local_650.
                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != (ChMatrixConstRef)0x0) {
                operator_delete(local_650.
                                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_650.
                                      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_650.
                                      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((ChMatrixConstRef)local_5f0.m_data != (ChMatrixConstRef)0x0) {
                free((void *)(((ChMatrixConstRef)((long)local_5f0.m_data + -0x40))->m_object).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols);
              }
              pRVar31 = (ChMatrixConstRef)local_530.m_data;
              if ((ChMatrixConstRef)local_610.m_data != (ChMatrixConstRef)0x0) {
                free((void *)(((ChMatrixConstRef)((long)local_610.m_data + -0x40))->m_object).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols);
                pRVar31 = (ChMatrixConstRef)local_530.m_data;
              }
              goto LAB_006746e8;
            }
            goto LAB_00674e40;
          }
        }
        pcVar27 = 
        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
        ;
LAB_00674e8e:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar27);
      }
    }
  }
  pcVar27 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
  ;
LAB_00674cca:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar27);
LAB_00674cb5:
  pcVar27 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_00674cca;
LAB_00674c96:
  pcVar27 = 
  "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 12, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 12, 1>]"
  ;
  goto LAB_00674cab;
LAB_00674cd4:
  pcVar27 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 12, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 12, BlockCols = 1, InnerPanel = false]"
  ;
LAB_00674d1f:
  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,pcVar27);
LAB_00674ceb:
  pcVar27 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
  ;
LAB_00674d00:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar27);
}

Assistant:

void ChElementBeamEuler::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 12) && (H.cols() == 12));
    assert(section);

    //
    // The K stiffness matrix and R damping matrix of this element:
    //

    if (Kfactor || Rfactor) {

        if (use_numerical_diff_for_KR) {

            // numerical evaluation of the K R  matrices
            double delta_p = 1e-5;
            double delta_r = 1e-3;

            ChVectorDynamic<> Fi0(12);
            ChVectorDynamic<> FiD(12);
            this->ComputeInternalForces(Fi0);
            ChMatrixDynamic<> H_num(12, 12);

            // K
            ChVector<>     pa0 = this->GetNodeA()->GetPos();
            ChQuaternion<> qa0 = this->GetNodeA()->GetRot();
            ChVector<>     pb0 = this->GetNodeB()->GetPos();
            ChQuaternion<> qb0 = this->GetNodeB()->GetRot();
            for (int i = 0; i < 3; ++i) {
                ChVector<> paD = pa0; 
                paD[i] += delta_p;
                this->GetNodeA()->SetPos(paD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i) = (FiD - Fi0) / delta_p;
                this->GetNodeA()->SetPos(pa0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> rotator(VNULL);  rotator[i] = delta_r;
                ChQuaternion<> mdeltarotL;  mdeltarotL.Q_from_Rotv(rotator); // rot.in local basis - as in system wide vectors
                ChQuaternion<> qaD = qa0 * mdeltarotL;
                this->GetNodeA()->SetRot(qaD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+3) = (FiD - Fi0) / delta_r;
                this->GetNodeA()->SetRot(qa0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> pbD = pb0; 
                pbD[i] += delta_p;
                this->GetNodeB()->SetPos(pbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+6) = (FiD - Fi0) / delta_p;
                this->GetNodeB()->SetPos(pb0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> rotator(VNULL);  rotator[i] = delta_r;
                ChQuaternion<> mdeltarotL;  mdeltarotL.Q_from_Rotv(rotator); // rot.in local basis - as in system wide vectors
                ChQuaternion<> qbD = qb0 * mdeltarotL;
                this->GetNodeB()->SetRot(qbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+9) = (FiD - Fi0) / delta_r;
                this->GetNodeB()->SetRot(qb0);
            }
            H.block(0, 0, 12, 12) = - H_num * Kfactor;

            // R
            ChVector<> va0 = this->GetNodeA()->GetPos_dt();
            ChVector<> wa0 = this->GetNodeA()->GetWvel_loc();
            ChVector<> vb0 = this->GetNodeB()->GetPos_dt();
            ChVector<> wb0 = this->GetNodeB()->GetWvel_loc();
            for (int i = 0; i < 3; ++i) {
                ChVector<> vaD = va0; 
                vaD[i] += delta_p;
                this->GetNodeA()->SetPos_dt(vaD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i) = (FiD - Fi0) / delta_p;
                this->GetNodeA()->SetPos_dt(va0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> waD = wa0; 
                waD[i] += delta_r;
                this->GetNodeA()->SetWvel_loc(waD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+3) = (FiD - Fi0) / delta_r;
                this->GetNodeA()->SetWvel_loc(wa0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> vbD = vb0; 
                vbD[i] += delta_p;
                this->GetNodeB()->SetPos_dt(vbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+6) = (FiD - Fi0) / delta_p;
                this->GetNodeB()->SetPos_dt(vb0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> wbD = wb0; 
                wbD[i] += delta_r;
                this->GetNodeB()->SetWvel_loc(wbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+9) = (FiD - Fi0) / delta_r;
                this->GetNodeB()->SetWvel_loc(wb0);
            }
            H.block(0, 0, 12, 12) += - H_num * Rfactor;

        }
        else {

            // Corotational K stiffness:
            ChMatrixDynamic<> CK(12, 12);
            ChMatrixDynamic<> CKCt(12, 12);  // the global, corotated, K matrix


            ChMatrixDynamic<> H_local;

            //
            // Corotate local stiffness matrix
            //

            ChMatrix33<> Atoabs(this->q_element_abs_rot);
            ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            std::vector<ChMatrix33<>*> R;
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelA);
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelB);

            if (this->use_geometric_stiffness) {
                // K = Km+Kg

                // For Kg, compute Px tension of the beam along centerline, using temporary but fast data structures:
                ChVectorDynamic<> displ(this->GetNdofs());
                this->GetStateBlock(displ);
                double Px = -this->Km.row(0) * displ;

                // Rayleigh damping (stiffness proportional part)  [R] = beta*[Km] , so H = kf*[Km+Kg]+rf*[R] = (kf+rf*beta)*[Km] + kf*Kg
                H_local = this->Km * (Kfactor + Rfactor * this->section->GetBeamRaleyghDampingBeta()) + this->Kg * Px * Kfactor;
            }
            else {
                // K = Km

                // Rayleigh damping (stiffness proportional part)  [R] = beta*[Km] , so H = kf*[Km]+rf*[R] = (kf+rf*beta)*[K]
                H_local = this->Km * (Kfactor + Rfactor * this->section->GetBeamRaleyghDampingBeta());
            }

            ChMatrixCorotation::ComputeCK(H_local, R, 4, CK);
            ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

            // For strict symmetry, copy L=U because the computations above might
            // lead to small errors because of numerical roundoff even with force_symmetric_stiffness
            if (force_symmetric_stiffness) {
                for (int row = 0; row < CKCt.rows() - 1; ++row)
                    for (int col = row + 1; col < CKCt.cols(); ++col)
                        CKCt(row, col) = CKCt(col, row);
            }

            //// RADU
            //// Check if the above can be done with the one-liner:
            ////CKCt.triangularView<Eigen::Upper>() = CKCt.transpose();

            H.block(0, 0, 12, 12) = CKCt;

            // Add inertial stiffness matrix and inertial damping matrix (gyroscopic damping), 
            // if enabled in section material.
            // These matrices are not symmetric. Also note
            if (this->section->compute_inertia_damping_matrix || this->section->compute_inertia_stiffness_matrix) {
                ChMatrixNM<double, 6, 6> matr_loc;
                ChMatrixNM<double, 6, 6> KRi_loc;
                KRi_loc.setZero();
                // A lumped version of the inertial damping/stiffness matrix computation is used here, on a per-node basis:
                double node_multiplier_fact_R = 0.5 * length * Rfactor;
                double node_multiplier_fact_K = 0.5 * length * Kfactor;
                for (int i = 0; i < nodes.size(); ++i) {
                    int stride = i * 6;
                    if (this->section->compute_inertia_damping_matrix) {
                        this->section->ComputeInertiaDampingMatrix(matr_loc, nodes[i]->GetWvel_loc());
                        KRi_loc += matr_loc * node_multiplier_fact_R;
                    }
                    if (this->section->compute_inertia_stiffness_matrix) {
                        this->section->ComputeInertiaStiffnessMatrix(matr_loc, nodes[i]->GetWvel_loc(), nodes[i]->GetWacc_loc(), (nodes[i]->GetA().transpose()) * nodes[i]->GetPos_dtdt()); // assume x_dtdt in local frame!
                        KRi_loc += matr_loc * node_multiplier_fact_K;
                    }
                    // corotate the local damping and stiffness matrices (at once, already scaled) into absolute one
                    //H.block<3, 3>(stride,   stride  ) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0,0) * (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(0,0) is null by construction
                    H.block<3, 3>(stride + 3, stride + 3) += KRi_loc.block<3, 3>(3, 3);
                    H.block<3, 3>(stride, stride + 3) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0, 3);
                    // H.block<3, 3>(stride+3, stride)   +=                    KRi_loc.block<3, 3>(3,0) * (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(3,0) is null by construction
                }
            }
        }

    } 
    else
		H.setZero();

    //
    // The M mass matrix of this element:  
    //

    if (Mfactor || (Rfactor && this->section->GetBeamRaleyghDampingAlpha()) ) {

        ChMatrixDynamic<> Mloc(12, 12);
        Mloc.setZero();
        ChMatrix33<> Mxw;

        //
        // "lumped" M mass matrix
        //
        ChMatrixNM<double, 6, 6> sectional_mass;
        this->section->ComputeInertiaMatrix(sectional_mass);

        // Rayleigh damping (stiffness proportional part)  [Rm] = alpha*[M] , so H += km*[M]+rf*[Rm]  H += (km+rf*alpha)*[M]

        double node_multiplier_fact = 0.5 * length * (Mfactor + Rfactor * this->section->GetBeamRaleyghDampingAlpha());
        for (int i = 0; i < nodes.size(); ++i) {
            int stride = i * 6;
            // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
            // hence it can be the simple (constant) expression
            //   Mloc.block<6, 6>(stride, stride) += sectional_mass * node_multiplier_fact;
            // but the more general case needs the rotations, hence:
            Mloc.block<3, 3>(stride,   stride  ) += sectional_mass.block<3, 3>(0,0) * node_multiplier_fact;
            Mloc.block<3, 3>(stride+3, stride+3) += sectional_mass.block<3, 3>(3,3) * node_multiplier_fact;
            Mxw = nodes[i]->GetA() * sectional_mass.block<3, 3>(0,3) * node_multiplier_fact;
            Mloc.block<3, 3>(stride,   stride+3) += Mxw;
            Mloc.block<3, 3>(stride+3, stride)   += Mxw.transpose();
        }
        
        /* The following would be needed if consistent mass matrix is used, but...
        ChMatrix33<> Atoabs(this->q_element_abs_rot);
        ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        std::vector< ChMatrix33<>* > R;
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelA);
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelB);

        ChMatrixCorotation::ComputeCK(Mloc, R, 4, CK);
        ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

        H.block(0,0,12,12) += CKCt;
        */

        // ..rather do this because lumped mass matrix does not need rotation transf.
        H.block(0, 0, 12, 12) += Mloc;

        //// TODO better per-node lumping, or 4x4 consistent mass matrices, maybe with integration if not uniform
        // materials.
    }

}